

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_null(void)

{
  byte bVar1;
  undefined8 uVar2;
  char *json;
  bson_t b;
  bson_error_t error;
  undefined1 local_380 [240];
  undefined1 local_290 [648];
  
  bVar1 = bson_init_from_json(local_380,"{ \"x\": null }",0xffffffffffffffff,local_290);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8de,"test_bson_json_null","bson_init_from_json (&b, json, -1, &error)");
    abort();
  }
  uVar2 = bson_bcone_magic();
  bVar1 = bcon_extract(local_380,"x",uVar2,9,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8df,"test_bson_json_null","BCON_EXTRACT (&b, \"x\", BCONE_NULL)");
    abort();
  }
  bson_destroy(local_380);
  return;
}

Assistant:

static void
test_bson_json_null (void)
{
   bson_error_t error;
   bson_t b;

   const char *json = "{ \"x\": null }";
   BSON_ASSERT (bson_init_from_json (&b, json, -1, &error));
   BSON_ASSERT (BCON_EXTRACT (&b, "x", BCONE_NULL));
   bson_destroy (&b);
}